

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<184u,Fixpp::Type::String>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)84>,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<174u,Fixpp::Type::String>,Fixpp::TagT<175u,Fixpp::Type::String>,Fixpp::TagT<176u,Fixpp::Type::String>,Fixpp::TagT<177u,Fixpp::Type::String>,Fixpp::TagT<178u,Fixpp::Type::String>,Fixpp::TagT<179u,Fixpp::Type::String>,Fixpp::TagT<180u,Fixpp::Type::String>,Fixpp::TagT<181u,Fixpp::Type::String>,Fixpp::TagT<182u,Fixpp::Type::String>,Fixpp::TagT<183u,Fixpp::Type::String>,Fixpp::TagT<184u,Fixpp::Type::String>,Fixpp::TagT<185u,Fixpp::Type::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<184u,Fixpp::Type::String>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_T_>,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>_>
          *tagSet,bool param_4,bool param_5)

{
  byte *pbVar1;
  StreamCursor *this_00;
  long lVar2;
  StreamBuf<char> *pSVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  long lVar7;
  char *pcVar8;
  Type type;
  
  this_00 = context->cursor;
  lVar2 = *(long *)&this_00->buf->field_0x8;
  pcVar8 = *(char **)&this_00->buf->field_0x10;
  while( true ) {
    pSVar3 = this_00->buf;
    if (*(long *)&pSVar3->field_0x18 == *(long *)&pSVar3->field_0x10) {
      lVar7 = (**(code **)(*(long *)pSVar3 + 0x38))();
      bVar6 = lVar7 == 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      pcVar8 = "Expected value tag \'%d\', got EOF";
      type = ParsingError;
      goto LAB_0046e177;
    }
    pSVar3 = this_00->buf;
    if (*(char **)&pSVar3->field_0x10 < *(char **)&pSVar3->field_0x18) {
      cVar5 = **(char **)&pSVar3->field_0x10;
    }
    else {
      cVar5 = (**(code **)(*(long *)pSVar3 + 0x48))();
    }
    if (cVar5 == '|') break;
    StreamCursor::advance(this_00,1);
  }
  lVar7 = *(long *)&this_00->buf->field_0x8;
  lVar4 = *(long *)&this_00->buf->field_0x10;
  bVar6 = StreamCursor::advance(this_00,1);
  if (bVar6) {
    (field->m_view).first = pcVar8;
    (field->m_view).second = (lVar2 + lVar4) - (long)(pcVar8 + lVar7);
    pbVar1 = (byte *)((long)(tagSet->
                            super_TagSet<Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>
                            ).bits.super__Base_bitset<6UL>._M_w + 0x17);
    *pbVar1 = *pbVar1 | 1;
    return;
  }
  pcVar8 = "Expected value after tag \'%d\', got EOF";
  type = Incomplete;
LAB_0046e177:
  ParsingContext::setError(context,type,pcVar8,0xb8);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }